

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O3

string * __thiscall
cmTimestamp::AddTimestampComponent_abi_cxx11_
          (string *__return_storage_ptr__,cmTimestamp *this,char flag,tm *timeStruct,time_t timeT,
          bool utcFlag,uint32_t microseconds)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char cVar5;
  char cVar6;
  uint uVar7;
  size_t sVar9;
  time_t __time0;
  long *plVar10;
  ulong uVar11;
  size_type *psVar12;
  uint uVar13;
  undefined7 in_register_00000011;
  string *this_00;
  ulong uVar14;
  double dVar15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  char buffer [16];
  string local_d8;
  string local_b8;
  undefined1 local_88 [8];
  long *plStack_80;
  long local_78 [4];
  char *local_58;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined8 local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  ulong uVar8;
  
  this_00 = &local_d8;
  local_88 = (undefined1  [8])0x1;
  local_78[0] = CONCAT71(local_78[0]._1_7_,0x25);
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)0x1;
  local_50._M_len = 1;
  local_40 = 1;
  views._M_len = 2;
  views._M_array = &local_50;
  local_b8._M_string_length = (size_type)paVar1;
  local_b8.field_2._M_local_buf[0] = flag;
  plStack_80 = local_78;
  local_50._M_str = (char *)local_78;
  local_38 = paVar1;
  cmCatViews_abi_cxx11_(&local_d8,views);
  iVar3 = (int)CONCAT71(in_register_00000011,flag);
  uVar7 = iVar3 - 0x41;
  uVar8 = (ulong)uVar7;
  if (uVar7 < 0x3a) {
    if ((0x340120b03341183U >> (uVar8 & 0x3f) & 1) == 0) {
      if (uVar8 == 0x25) {
        uVar7 = microseconds % 1000000;
        cVar6 = '\x01';
        if (9 < uVar7) {
          uVar13 = uVar7;
          cVar5 = '\x04';
          do {
            cVar6 = cVar5;
            if (uVar13 < 100) {
              cVar6 = cVar6 + -2;
              goto LAB_003c9393;
            }
            if (uVar13 < 1000) {
              cVar6 = cVar6 + -1;
              goto LAB_003c9393;
            }
            if (uVar13 < 10000) goto LAB_003c9393;
            bVar2 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar5 = cVar6 + '\x04';
          } while (bVar2);
          cVar6 = cVar6 + '\x01';
        }
LAB_003c9393:
        local_88 = (undefined1  [8])local_78;
        std::__cxx11::string::_M_construct((ulong)local_88,cVar6);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_88,(uint)plStack_80,uVar7);
        local_b8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_b8,'\x06' - (char)plStack_80);
        plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_88);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar12 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar12) {
          lVar4 = plVar10[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar10;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
        }
        __return_storage_ptr__->_M_string_length = plVar10[1];
        *plVar10 = (long)psVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p,
                          CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                   local_b8.field_2._M_local_buf[0]) + 1);
        }
        if (local_88 != (undefined1  [8])local_78) {
          operator_delete((void *)local_88,local_78[0] + 1);
        }
        goto LAB_003c915d;
      }
      if (uVar8 == 0x32) {
        local_88 = (undefined1  [8])0x0;
        local_78[1]._0_4_ = 0;
        local_78[1]._4_4_ = 0;
        local_78[2] = 0;
        local_78[3] = 0;
        local_58 = (char *)0x0;
        plStack_80 = (long *)0x100000000;
        local_78[0] = 0x4600000000;
        __time0 = CreateUtcTimeTFromTm((cmTimestamp *)this_00,(tm *)local_88);
        if (__time0 == -1) {
          local_b8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,
                     "Error generating UNIX epoch in string(TIMESTAMP ...) or file(TIMESTAMP ...). Please, file a bug report against CMake"
                     ,"");
          cmSystemTools::Error(&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_b8._M_dataplus._M_p,
                            CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                     local_b8.field_2._M_local_buf[0]) + 1);
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        }
        else {
          dVar15 = difftime(timeT,__time0);
          uVar14 = (ulong)dVar15;
          uVar8 = -uVar14;
          if (0 < (long)uVar14) {
            uVar8 = uVar14;
          }
          uVar7 = 1;
          if (9 < uVar8) {
            uVar11 = uVar8;
            uVar13 = 4;
            do {
              uVar7 = uVar13;
              if (uVar11 < 100) {
                uVar7 = uVar7 - 2;
                goto LAB_003c9466;
              }
              if (uVar11 < 1000) {
                uVar7 = uVar7 - 1;
                goto LAB_003c9466;
              }
              if (uVar11 < 10000) goto LAB_003c9466;
              bVar2 = 99999 < uVar11;
              uVar11 = uVar11 / 10000;
              uVar13 = uVar7 + 4;
            } while (bVar2);
            uVar7 = uVar7 + 1;
          }
LAB_003c9466:
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct
                    ((ulong)__return_storage_ptr__,(char)uVar7 - (char)((long)uVar14 >> 0x3f));
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((__return_storage_ptr__->_M_dataplus)._M_p + -((long)uVar14 >> 0x3f),uVar7,
                     uVar8);
        }
        goto LAB_003c915d;
      }
      goto LAB_003c9261;
    }
  }
  else {
LAB_003c9261:
    if (iVar3 != 0x25) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == &local_d8.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,local_d8.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_d8.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_d8._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,local_d8.field_2._M_local_buf[0])
        ;
      }
      __return_storage_ptr__->_M_string_length = local_d8._M_string_length;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      goto LAB_003c915d;
    }
  }
  sVar9 = strftime(local_88,0x10,local_d8._M_dataplus._M_p,(tm *)timeStruct);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_88,local_88 + sVar9);
LAB_003c915d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::AddTimestampComponent(
  char flag, struct tm& timeStruct, const time_t timeT, const bool utcFlag,
  const uint32_t microseconds) const
{
  std::string formatString = cmStrCat('%', flag);

  switch (flag) {
    case 'a':
    case 'A':
    case 'b':
    case 'B':
    case 'd':
    case 'H':
    case 'I':
    case 'j':
    case 'm':
    case 'M':
    case 'S':
    case 'U':
    case 'V':
    case 'w':
    case 'y':
    case 'Y':
    case '%':
      break;
    case 'Z':
#if defined(__GLIBC__)
      // 'struct tm' has the time zone, so strftime can honor UTC.
      static_cast<void>(utcFlag);
#else
      // 'struct tm' may not have the time zone, so strftime may
      // use local time.  Hard-code the UTC result.
      if (utcFlag) {
        return std::string("GMT");
      }
#endif
      break;
    case 'z': {
#if defined(__GLIBC__)
      // 'struct tm' has the time zone, so strftime can honor UTC.
      static_cast<void>(utcFlag);
#else
      // 'struct tm' may not have the time zone, so strftime may
      // use local time.  Hard-code the UTC result.
      if (utcFlag) {
        return std::string("+0000");
      }
#endif
#ifndef _AIX
      break;
#else
      std::string xpg_sus_old;
      bool const xpg_sus_was_set =
        cmSystemTools::GetEnv("XPG_SUS_ENV", xpg_sus_old);
      if (xpg_sus_was_set && xpg_sus_old == "ON") {
        break;
      }
      xpg_sus_old = "XPG_SUS_ENV=" + xpg_sus_old;

      // On AIX systems, %z requires XPG_SUS_ENV=ON to work as desired.
      cmSystemTools::PutEnv("XPG_SUS_ENV=ON");
      tzset();

      char buffer[16];
      size_t size = strftime(buffer, sizeof(buffer), "%z", &timeStruct);

#  ifndef CMAKE_BOOTSTRAP
      if (xpg_sus_was_set) {
        cmSystemTools::PutEnv(xpg_sus_old);
      } else {
        cmSystemTools::UnsetEnv("XPG_SUS_ENV");
      }
#  else
      // No UnsetEnv during bootstrap.  This is good enough for CMake itself.
      cmSystemTools::PutEnv(xpg_sus_old);
      static_cast<void>(xpg_sus_was_set);
#  endif
      tzset();

      return std::string(buffer, size);
#endif
    }
    case 's': // Seconds since UNIX epoch (midnight 1-jan-1970)
    {
      // Build a time_t for UNIX epoch and subtract from the input "timeT":
      struct tm tmUnixEpoch;
      memset(&tmUnixEpoch, 0, sizeof(tmUnixEpoch));
      tmUnixEpoch.tm_mday = 1;
      tmUnixEpoch.tm_year = 1970 - 1900;

      const time_t unixEpoch = this->CreateUtcTimeTFromTm(tmUnixEpoch);
      if (unixEpoch == -1) {
        cmSystemTools::Error(
          "Error generating UNIX epoch in string(TIMESTAMP ...) or "
          "file(TIMESTAMP ...). Please, file a bug report against CMake");
        return std::string();
      }

      return std::to_string(static_cast<long int>(difftime(timeT, unixEpoch)));
    }
    case 'f': // microseconds
    {
      // clip number to 6 digits and pad with leading zeros
      std::string microsecs = std::to_string(microseconds % 1000000);
      return std::string(6 - microsecs.length(), '0') + microsecs;
    }
    default: {
      return formatString;
    }
  }

  char buffer[16];

#ifdef __MINGW32__
  /* See a bug in MinGW: https://sourceforge.net/p/mingw-w64/bugs/793/. A work
   * around is to try to use strftime() from ucrtbase.dll. */
  using T = size_t(__cdecl*)(char*, size_t, const char*, const struct tm*);
  auto loadUcrtStrftime = []() -> T {
    auto handle =
      LoadLibraryExA("ucrtbase.dll", nullptr, LOAD_LIBRARY_SEARCH_SYSTEM32);
    if (handle) {
#  pragma GCC diagnostic push
#  pragma GCC diagnostic ignored "-Wcast-function-type"
      return reinterpret_cast<T>(GetProcAddress(handle, "strftime"));
#  pragma GCC diagnostic pop
    }
    return nullptr;
  };
  static T ucrtStrftime = loadUcrtStrftime();

  if (ucrtStrftime) {
    size_t size =
      ucrtStrftime(buffer, sizeof(buffer), formatString.c_str(), &timeStruct);
    return std::string(buffer, size);
  }
#endif

  size_t size =
    strftime(buffer, sizeof(buffer), formatString.c_str(), &timeStruct);

  return std::string(buffer, size);
}